

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofXyz.cpp
# Opt level: O2

void __thiscall
OpenMD::GofXyz::GofXyz
          (GofXyz *this,SimInfo *info,string *filename,string *sele1,string *sele2,string *sele3,
          RealType len,int nrbins)

{
  SelectionEvaluator *this_00;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  *this_01;
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  ulong uVar3;
  uint j;
  ulong uVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  RadialDistrFunc::RadialDistrFunc(&this->super_RadialDistrFunc,info,filename,sele1,sele2,nrbins);
  (this->super_RadialDistrFunc).super_StaticAnalyser._vptr_StaticAnalyser =
       (_func_int **)&PTR__GofXyz_002ed390;
  this->len_ = len;
  this->halfLen_ = len * 0.5;
  this_00 = &this->evaluator3_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  SelectionManager::SelectionManager(&this->seleMan3_,info);
  this_01 = &this->histogram_;
  (this->histogram_).
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->rotMats_)._M_t._M_impl.super__Rb_tree_header;
  (this->rotMats_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->rotMats_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->rotMats_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->rotMats_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->rotMats_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  getPrefix(&local_50,filename);
  std::operator+(&local_70,&local_50,".gxyz");
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_RadialDistrFunc).super_StaticAnalyser.outputFilename_);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  SelectionEvaluator::loadScriptString(this_00,sele3);
  if ((this->evaluator3_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_70,this_00);
    SelectionManager::setSelectionSet(&this->seleMan3_,(SelectionSet *)&local_70);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_70);
  }
  uVar2 = (ulong)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_;
  this->deltaR_ = this->len_ / (double)uVar2;
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::resize(this_01,uVar2);
  uVar2 = (ulong)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_;
  for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::resize((this_01->
             super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + uVar3,uVar2);
    lVar5 = 0;
    for (uVar4 = 0; uVar2 = (ulong)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_,
        uVar4 < uVar2; uVar4 = uVar4 + 1) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 (*(long *)&(this_01->
                            super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar3].
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data + lVar5),uVar2);
      lVar5 = lVar5 + 0x18;
    }
  }
  return;
}

Assistant:

GofXyz::GofXyz(SimInfo* info, const std::string& filename,
                 const std::string& sele1, const std::string& sele2,
                 const std::string& sele3, RealType len, int nrbins) :
      RadialDistrFunc(info, filename, sele1, sele2, nrbins),
      len_(len), halfLen_(len / 2), evaluator3_(info), seleMan3_(info) {
    setOutputName(getPrefix(filename) + ".gxyz");

    evaluator3_.loadScriptString(sele3);
    if (!evaluator3_.isDynamic()) {
      seleMan3_.setSelectionSet(evaluator3_.evaluate());
    }

    deltaR_ = len_ / nBins_;

    histogram_.resize(nBins_);
    for (unsigned int i = 0; i < nBins_; ++i) {
      histogram_[i].resize(nBins_);
      for (unsigned int j = 0; j < nBins_; ++j) {
        histogram_[i][j].resize(nBins_);
      }
    }
  }